

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoders_controller.cc
# Opt level: O1

bool __thiscall
draco::SequentialAttributeDecodersController::DecodeAttributes
          (SequentialAttributeDecodersController *this,DecoderBuffer *buffer)

{
  PointsSequencer *pPVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  uint uVar5;
  ulong uVar6;
  
  pPVar1 = (this->sequencer_)._M_t.
           super___uniq_ptr_impl<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>
           ._M_t.
           super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
           .super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl;
  if (pPVar1 != (PointsSequencer *)0x0) {
    pPVar1->out_point_ids_ = &this->point_ids_;
    iVar3 = (*pPVar1->_vptr_PointsSequencer[3])();
    if ((char)iVar3 != '\0') {
      uVar4 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                _vptr_AttributesDecoderInterface[6])(this);
      if (0 < (int)uVar4) {
        uVar6 = 0;
        do {
          iVar3 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                    _vptr_AttributesDecoderInterface[7])(this);
          lVar2 = *(long *)(CONCAT44(extraout_var,iVar3) + 8);
          iVar3 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                    _vptr_AttributesDecoderInterface[5])(this,uVar6);
          pPVar1 = (this->sequencer_)._M_t.
                   super___uniq_ptr_impl<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
                   .super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl;
          iVar3 = (*pPVar1->_vptr_PointsSequencer[2])
                            (pPVar1,*(undefined8 *)(*(long *)(lVar2 + 0x10) + (long)iVar3 * 8));
          if ((char)iVar3 == '\0') {
            return false;
          }
          uVar5 = (int)uVar6 + 1;
          uVar6 = (ulong)uVar5;
        } while (uVar4 != uVar5);
      }
      iVar3 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                _vptr_AttributesDecoderInterface[9])(this,buffer);
      if (((char)iVar3 != '\0') &&
         (iVar3 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                    _vptr_AttributesDecoderInterface[10])(this,buffer), (char)iVar3 != '\0')) {
        iVar3 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                  _vptr_AttributesDecoderInterface[0xb])(this);
        return SUB41(iVar3,0);
      }
    }
  }
  return false;
}

Assistant:

bool SequentialAttributeDecodersController::DecodeAttributes(
    DecoderBuffer *buffer) {
  if (!sequencer_ || !sequencer_->GenerateSequence(&point_ids_)) {
    return false;
  }
  // Initialize point to attribute value mapping for all decoded attributes.
  const int32_t num_attributes = GetNumAttributes();
  for (int i = 0; i < num_attributes; ++i) {
    PointAttribute *const pa =
        GetDecoder()->point_cloud()->attribute(GetAttributeId(i));
    if (!sequencer_->UpdatePointToAttributeIndexMapping(pa)) {
      return false;
    }
  }
  return AttributesDecoder::DecodeAttributes(buffer);
}